

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

osgen_txtwin_t *
osgen_create_txtwin(int where,void *other,void *parent,uint buf_size,uint buf_lines)

{
  osgen_txtwin_t *win_00;
  char *pcVar1;
  char **ppcVar2;
  uint in_ECX;
  undefined4 in_EDI;
  uint in_R8D;
  void *unaff_retaddr;
  osgen_txtwin_t *win;
  undefined4 in_stack_fffffffffffffff0;
  osgen_win_t *in_stack_fffffffffffffff8;
  
  win_00 = (osgen_txtwin_t *)
           osgen_create_win(win._4_4_,(int)win,unaff_retaddr,in_stack_fffffffffffffff8);
  if (win_00 == (osgen_txtwin_t *)0x0) {
    win_00 = (osgen_txtwin_t *)0x0;
  }
  else {
    win_00->txtbufsiz = (ulong)in_ECX;
    pcVar1 = (char *)malloc((ulong)in_ECX);
    win_00->txtbuf = pcVar1;
    win_00->line_ptr_cnt = (ulong)in_R8D;
    ppcVar2 = (char **)malloc((ulong)in_R8D << 3);
    win_00->line_ptr = ppcVar2;
    if ((win_00->txtbuf == (char *)0x0) || (win_00->line_ptr == (char **)0x0)) {
      osgen_delete_win((osgen_win_t *)CONCAT44(in_EDI,in_stack_fffffffffffffff0));
      win_00 = (osgen_txtwin_t *)0x0;
    }
    else {
      win_00->txtfree = win_00->txtbuf;
      win_00->line_count = 1;
      win_00->first_line = 0;
      *win_00->line_ptr = win_00->txtbuf;
      win_00->solfg = (int)(win_00->base).txtfg;
      win_00->solbg = (int)(win_00->base).txtbg;
      win_00->solattr = (win_00->base).txtattr;
      osssb_add_color_code(win_00);
    }
  }
  return win_00;
}

Assistant:

static osgen_txtwin_t *osgen_create_txtwin(int where, void *other,
                                           void *parent,
                                           unsigned int buf_size,
                                           unsigned int buf_lines)
{
    osgen_txtwin_t *win;
    
    /* create the base window */
    win = (osgen_txtwin_t *)osgen_create_win(OS_BANNER_TYPE_TEXT,
                                             where, other, parent);

    /* if that failed, give up now */
    if (win == 0)
        return 0;

    /* allocate the window's buffer */
    win->txtbufsiz = buf_size;
    win->txtbuf = (char *)osmalloc(buf_size);

    /* allocate the line starts */
    win->line_ptr_cnt = buf_lines;
    win->line_ptr = (char **)osmalloc(buf_lines * sizeof(char *));

    /* make sure we allocated everything properly */
    if (win->txtbuf == 0 || win->line_ptr == 0)
    {
        /* free anything we allocated */
        osgen_delete_win(&win->base);
        
        /* return failure */
        return 0;
    }

    /* set up the buffer free pointer */
    win->txtfree = win->txtbuf;

    /* start out with a single line in the buffer */
    win->line_count = 1;

    /* set up the first line start */
    win->first_line = 0;
    win->line_ptr[0] = win->txtbuf;

    /* initialize the start-of-line colors */
    win->solfg = win->base.txtfg;
    win->solbg = win->base.txtbg;
    win->solattr = win->base.txtattr;

    /* start the new first line with the current text color */
    osssb_add_color_code(win);

    /* return the new window */
    return win;
}